

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
__thiscall
duckdb::NextValLocalFunction
          (duckdb *this,ExpressionState *state,BoundFunctionExpression *expr,FunctionData *bind_data
          )

{
  SequenceCatalogEntry *args_1;
  ClientContext *context;
  DuckTransaction *args;
  undefined8 local_20;
  
  if (bind_data == (FunctionData *)0x0) {
    local_20 = 0;
  }
  else {
    context = ExpressionState::GetContext(state);
    args_1 = (SequenceCatalogEntry *)bind_data[1]._vptr_FunctionData;
    args = DuckTransaction::Get(context,(args_1->super_StandardEntry).super_InCatalogEntry.catalog);
    make_uniq<duckdb::NextValLocalState,duckdb::DuckTransaction&,duckdb::SequenceCatalogEntry&>
              ((duckdb *)&local_20,args,args_1);
  }
  *(undefined8 *)this = local_20;
  return (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         this;
}

Assistant:

unique_ptr<FunctionLocalState> NextValLocalFunction(ExpressionState &state, const BoundFunctionExpression &expr,
                                                    FunctionData *bind_data) {
	if (!bind_data) {
		return nullptr;
	}
	auto &context = state.GetContext();
	auto &info = bind_data->Cast<NextvalBindData>();
	auto &sequence = info.sequence;
	auto &transaction = DuckTransaction::Get(context, sequence.catalog);
	return make_uniq<NextValLocalState>(transaction, sequence);
}